

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void mp::internal::SignalHandler::HandleSigInt(int sig)

{
  ssize_t sVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    sVar1 = write(1,(void *)(uVar3 + signal_message_ptr_),(ulong)(signal_message_size_ - (int)uVar3)
                 );
    if ((int)sVar1 < 0) break;
    uVar2 = (int)uVar3 + (int)sVar1;
    uVar3 = (ulong)uVar2;
  } while (uVar2 < signal_message_size_);
  if (stop_ < 2) {
    stop_ = stop_ + 1;
    if (handler_ != (code *)0x0) {
      (*handler_)(data_);
    }
    signal(sig,HandleSigInt);
    return;
  }
  _exit(1);
}

Assistant:

void SignalHandler::HandleSigInt(int sig) {
  unsigned count = 0;
  do {
    // Use asynchronous-safe function write instead of printf!
    int result = MP_WRITE(1, signal_message_ptr_ + count,
        signal_message_size_ - count);
    if (result < 0) break;
    count += result;
  } while (count < signal_message_size_);
  if (stop_>1) {    // AMPL seems to send 2x SIGINT
    // Use asynchronous-safe function _exit instead of exit!
    _exit(1);
  }
  ++stop_;
  if (InterruptHandler handler = handler_)
    handler(data_);
  // Restore the handler since it might have been reset before the handler
  // is called (this is implementation defined).
  std::signal(sig, HandleSigInt);
}